

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Promise<void> __thiscall kj::TaskSet::onEmpty(TaskSet *this)

{
  WeakFulfillerBase *pWVar1;
  undefined8 *puVar2;
  long *plVar3;
  Fault node;
  char cVar4;
  WeakFulfiller<void> *params;
  long in_RSI;
  Fault f;
  Fault local_50;
  WeakFulfillerBase *local_48;
  long *local_40;
  Exception *local_38;
  
  if (*(long *)(in_RSI + 0x18) != 0) {
    cVar4 = (**(code **)(**(long **)(in_RSI + 0x18) + 8))();
    if (cVar4 != '\0') {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x18b,FAILED,(char *)0x0,"\"onEmpty() can only be called once at a time\"",
                 (char (*) [44])"onEmpty() can only be called once at a time");
      kj::_::Debug::Fault::fatal(&local_50);
    }
  }
  if (*(long *)(in_RSI + 8) == 0) {
    kj::_::readyNow();
    this->errorHandler = (ErrorHandler *)local_50.exception;
  }
  else {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    pWVar1 = &params->super_WeakFulfillerBase;
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_0038bc70;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_0038bca8;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_38,params);
    local_50.exception = local_38;
    local_40 = (long *)0x0;
    puVar2 = *(undefined8 **)(in_RSI + 0x10);
    plVar3 = *(long **)(in_RSI + 0x18);
    *(WeakFulfillerBase **)(in_RSI + 0x10) = pWVar1;
    *(WeakFulfiller<void> **)(in_RSI + 0x18) = params;
    local_48 = pWVar1;
    if (plVar3 != (long *)0x0) {
      (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    plVar3 = local_40;
    this->errorHandler = (ErrorHandler *)local_50.exception;
    local_50.exception = (Exception *)0x0;
    if (local_40 != (long *)0x0) {
      local_40 = (long *)0x0;
      (**(local_48->super_Disposer)._vptr_Disposer)
                (local_48,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    node.exception = local_50.exception;
    if (local_50.exception != (Exception *)0x0) {
      local_50.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> TaskSet::onEmpty() {
  KJ_IF_SOME(fulfiller, emptyFulfiller) {
    if (fulfiller->isWaiting()) {
      KJ_FAIL_REQUIRE("onEmpty() can only be called once at a time");
    }
  }

  if (tasks == kj::none) {
    return READY_NOW;
  } else {
    auto paf = newPromiseAndFulfiller<void>();
    emptyFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}